

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::MultiPartOutputFile::Data::writeHeadersToFile
          (Data *this,vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *headers)

{
  size_t __n;
  int iVar1;
  string *psVar2;
  uint64_t uVar3;
  long lVar4;
  bool isTiled;
  pointer pHVar5;
  ulong uVar6;
  long lVar7;
  
  pHVar5 = (headers->super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((headers->super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>)._M_impl.
      super__Vector_impl_data._M_finish != pHVar5) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      psVar2 = Header::type_abi_cxx11_((Header *)(&(pHVar5->_map)._M_t._M_impl.field_0x0 + lVar7));
      __n = psVar2->_M_string_length;
      if (__n == _DAT_001e8188) {
        isTiled = true;
        if (__n != 0) {
          iVar1 = bcmp((psVar2->_M_dataplus)._M_p,TILEDIMAGE_abi_cxx11_,__n);
          if (iVar1 != 0) goto LAB_00190808;
        }
      }
      else {
LAB_00190808:
        isTiled = false;
      }
      uVar3 = Header::writeTo((Header *)
                              ((long)&(((headers->
                                        super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->_map)._M_t.
                                      _M_impl + lVar7),(this->super_OutputStreamMutex).os,isTiled);
      (this->parts).
      super__Vector_base<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar6]->previewPosition = uVar3;
      uVar6 = uVar6 + 1;
      pHVar5 = (headers->super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar4 = (long)(headers->super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>)
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar5;
      lVar7 = lVar7 + 0x38;
    } while (uVar6 < (ulong)((lVar4 >> 3) * 0x6db6db6db6db6db7));
    if (lVar4 == 0x38) {
      return;
    }
  }
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>((this->super_OutputStreamMutex).os,"");
  return;
}

Assistant:

void
MultiPartOutputFile::Data::writeHeadersToFile (const vector<Header>& headers)
{
    for (size_t i = 0; i < headers.size (); i++)
    {

        // (TODO) consider deep files' preview images here.
        if (headers[i].type () == TILEDIMAGE)
            parts[i]->previewPosition = headers[i].writeTo (*os, true);
        else
            parts[i]->previewPosition = headers[i].writeTo (*os, false);
    }

    //
    // If a multipart file, write zero-length attribute name to mark the end of all headers.
    //

    if (headers.size () != 1)
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*os, "");
}